

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O3

double find_split_full_gain_weighted<float,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>,long_double>
                 (float *x,size_t st,size_t end,size_t *ix_arr,size_t *cols_use,size_t ncols_use,
                 bool force_cols_use,double *X_row_major,size_t ncols,double *Xr,size_t *Xr_ind,
                 size_t *Xr_indptr,double *buffer_sum_left,double *buffer_sum_tot,size_t *split_ix,
                 double *split_point,bool x_uses_ix_arr,
                 robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>
                 *w)

{
  double dVar1;
  ulong uVar2;
  size_t *psVar3;
  char cVar4;
  double *pdVar5;
  size_t sVar6;
  ulong uVar7;
  size_t row;
  double *pdVar8;
  size_t sVar9;
  ulong uVar10;
  size_t __n;
  long lVar11;
  size_t sVar12;
  bool bVar13;
  bool bVar14;
  double dVar15;
  undefined1 auVar16 [16];
  double dVar17;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  double *pdVar27;
  double *pdVar28;
  pair<tsl::detail_robin_hash::robin_hash<std::pair<unsigned_long,_double>,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::KeySelect,_tsl::robin_map<unsigned_long,_double,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::ValueSelect,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<std::pair<unsigned_long,_double>_>,_false,_tsl::rh::power_of_two_growth_policy<2UL>_>::robin_iterator<false>,_bool>
  pVar29;
  tuple<> local_b9;
  double local_b8;
  double *local_b0;
  _Head_base<0UL,_const_unsigned_long_&,_false> local_a8;
  double local_a0;
  size_t *local_98;
  double local_90;
  double local_88;
  size_t local_80;
  float *local_78;
  double local_70;
  double *local_68;
  undefined8 uStack_60;
  double local_58;
  undefined8 uStack_50;
  double *local_48;
  undefined8 uStack_40;
  size_t local_38;
  
  if (st < end) {
    if ((ncols_use != 0 && cols_use != (size_t *)0x0) &&
       (auVar23._8_4_ = (int)(ncols_use >> 0x20), auVar23._0_8_ = ncols_use,
       auVar23._12_4_ = 0x45300000, auVar16._8_4_ = (int)(ncols >> 0x20), auVar16._0_8_ = ncols,
       auVar16._12_4_ = 0x45300000,
       ((auVar23._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)ncols_use) - 4503599627370496.0)) /
       ((auVar16._8_8_ - 1.9342813113834067e+25) +
       ((double)CONCAT44(0x43300000,(int)ncols) - 4503599627370496.0)) < 0.1)) {
      force_cols_use = true;
    }
    local_58 = (double)CONCAT71(local_58._1_7_,force_cols_use);
    local_98 = ix_arr;
    local_90 = (double)st;
    local_80 = ncols_use;
    local_78 = x;
    local_68 = (double *)cols_use;
    if (x_uses_ix_arr) {
      pdVar28 = (double *)(ix_arr + st);
      local_70 = 0.0;
      do {
        local_a8._M_head_impl = (unsigned_long *)pdVar28;
        pVar29 = tsl::detail_robin_hash::
                 robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                 ::
                 insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                           ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                             *)w,(unsigned_long *)pdVar28,
                            (piecewise_construct_t *)&std::piecewise_construct,
                            (tuple<const_unsigned_long_&> *)&local_a8,(tuple<> *)&local_b8);
        local_70 = local_70 + *(double *)((pVar29.first.m_bucket.m_bucket)->m_value + 8);
        st = st + 1;
        pdVar28 = pdVar28 + 1;
      } while (st <= end);
    }
    else {
      local_70 = 0.0;
      local_b8 = (double)st;
      do {
        local_a8._M_head_impl = (unsigned_long *)&local_b8;
        pVar29 = tsl::detail_robin_hash::
                 robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                 ::
                 insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                           ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                             *)w,(unsigned_long *)&local_b8,
                            (piecewise_construct_t *)&std::piecewise_construct,
                            (tuple<const_unsigned_long_&> *)&local_a8,&local_b9);
        local_70 = local_70 + *(double *)((pVar29.first.m_bucket.m_bucket)->m_value + 8);
        local_b8 = (double)((long)local_b8 + 1);
      } while ((ulong)local_b8 <= end);
    }
    cVar4 = local_58._0_1_;
    sVar6 = ncols;
    if (local_58._0_1_ != '\0') {
      sVar6 = local_80;
    }
    __n = sVar6 << 3;
    memset(buffer_sum_tot,0,__n);
    pdVar28 = local_68;
    sVar6 = local_80;
    local_88 = (double)end;
    local_38 = __n;
    if (Xr_indptr == (size_t *)0x0) {
      if (cVar4 == '\0') {
        dVar17 = local_90;
        if (x_uses_ix_arr) {
          do {
            local_a8._M_head_impl = local_98 + (long)dVar17;
            pVar29 = tsl::detail_robin_hash::
                     robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                     ::
                     insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                               ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                 *)w,local_a8._M_head_impl,
                                (piecewise_construct_t *)&std::piecewise_construct,
                                (tuple<const_unsigned_long_&> *)&local_a8,(tuple<> *)&local_b8);
            if (ncols != 0) {
              sVar6 = local_98[(long)dVar17];
              local_b0 = *(double **)((pVar29.first.m_bucket.m_bucket)->m_value + 8);
              sVar12 = 0;
              do {
                dVar15 = fma((double)local_b0,X_row_major[sVar6 * ncols + sVar12],
                             buffer_sum_tot[sVar12]);
                buffer_sum_tot[sVar12] = dVar15;
                sVar12 = sVar12 + 1;
              } while (ncols != sVar12);
            }
            dVar17 = (double)((long)dVar17 + 1);
          } while ((ulong)dVar17 <= (ulong)local_88);
        }
        else {
          local_b8 = local_90;
          do {
            local_a8._M_head_impl = (unsigned_long *)&local_b8;
            pVar29 = tsl::detail_robin_hash::
                     robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                     ::
                     insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                               ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                 *)w,local_a8._M_head_impl,
                                (piecewise_construct_t *)&std::piecewise_construct,
                                (tuple<const_unsigned_long_&> *)&local_a8,&local_b9);
            dVar17 = local_b8;
            if (ncols != 0) {
              sVar6 = local_98[(long)local_b8];
              local_b0 = *(double **)((pVar29.first.m_bucket.m_bucket)->m_value + 8);
              sVar12 = 0;
              do {
                dVar15 = fma((double)local_b0,X_row_major[sVar6 * ncols + sVar12],
                             buffer_sum_tot[sVar12]);
                buffer_sum_tot[sVar12] = dVar15;
                sVar12 = sVar12 + 1;
              } while (ncols != sVar12);
            }
            local_b8 = (double)((long)dVar17 + 1);
          } while ((ulong)local_b8 <= (ulong)local_88);
        }
      }
      else {
        dVar17 = local_90;
        if (x_uses_ix_arr) {
          do {
            local_a8._M_head_impl = local_98 + (long)dVar17;
            dVar15 = (double)*local_a8._M_head_impl;
            local_a0 = dVar17;
            pVar29 = tsl::detail_robin_hash::
                     robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                     ::
                     insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                               ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                 *)w,local_a8._M_head_impl,
                                (piecewise_construct_t *)&std::piecewise_construct,
                                (tuple<const_unsigned_long_&> *)&local_a8,(tuple<> *)&local_b8);
            pdVar28 = local_68;
            if (sVar6 != 0) {
              local_b0 = *(double **)((pVar29.first.m_bucket.m_bucket)->m_value + 8);
              sVar12 = 0;
              do {
                dVar17 = fma((double)local_b0,
                             X_row_major[(long)dVar15 * ncols + (long)pdVar28[sVar12]],
                             buffer_sum_tot[sVar12]);
                buffer_sum_tot[sVar12] = dVar17;
                sVar12 = sVar12 + 1;
              } while (sVar6 != sVar12);
            }
            dVar17 = (double)((long)local_a0 + 1U);
          } while ((long)local_a0 + 1U <= (ulong)local_88);
        }
        else {
          do {
            sVar12 = local_98[(long)dVar17];
            local_a8._M_head_impl = (unsigned_long *)&local_b8;
            local_b8 = dVar17;
            pVar29 = tsl::detail_robin_hash::
                     robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                     ::
                     insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                               ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                                 *)w,local_a8._M_head_impl,
                                (piecewise_construct_t *)&std::piecewise_construct,
                                (tuple<const_unsigned_long_&> *)&local_a8,&local_b9);
            if (sVar6 != 0) {
              local_b0 = *(double **)((pVar29.first.m_bucket.m_bucket)->m_value + 8);
              sVar9 = 0;
              do {
                dVar17 = fma((double)local_b0,X_row_major[sVar12 * ncols + (long)pdVar28[sVar9]],
                             buffer_sum_tot[sVar9]);
                buffer_sum_tot[sVar9] = dVar17;
                sVar9 = sVar9 + 1;
              } while (sVar6 != sVar9);
            }
            local_b8 = (double)((long)local_b8 + 1);
            dVar17 = local_b8;
          } while ((ulong)local_b8 <= (ulong)local_88);
        }
      }
    }
    else if (cVar4 == '\0') {
      dVar17 = local_90;
      if (x_uses_ix_arr) {
        do {
          pdVar28 = (double *)(local_98 + (long)dVar17);
          sVar6 = Xr_indptr[(long)*pdVar28];
          local_a8._M_head_impl = (unsigned_long *)pdVar28;
          local_a0 = dVar17;
          pVar29 = tsl::detail_robin_hash::
                   robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                   ::
                   insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                             ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                               *)w,(unsigned_long *)pdVar28,
                              (piecewise_construct_t *)&std::piecewise_construct,
                              (tuple<const_unsigned_long_&> *)&local_a8,(tuple<> *)&local_b8);
          sVar12 = Xr_indptr[(long)*pdVar28 + 1];
          if (sVar12 != sVar6) {
            local_b0 = *(double **)((pVar29.first.m_bucket.m_bucket)->m_value + 8);
            do {
              sVar9 = Xr_ind[sVar6];
              dVar17 = fma((double)local_b0,Xr[sVar6],buffer_sum_tot[sVar9]);
              buffer_sum_tot[sVar9] = dVar17;
              sVar6 = sVar6 + 1;
            } while (sVar12 != sVar6);
          }
          dVar17 = (double)((long)local_a0 + 1U);
        } while ((long)local_a0 + 1U <= (ulong)local_88);
      }
      else {
        do {
          psVar3 = local_98;
          sVar6 = Xr_indptr[local_98[(long)dVar17]];
          local_a8._M_head_impl = (unsigned_long *)&local_b8;
          local_b8 = dVar17;
          pVar29 = tsl::detail_robin_hash::
                   robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                   ::
                   insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                             ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                               *)w,local_a8._M_head_impl,
                              (piecewise_construct_t *)&std::piecewise_construct,
                              (tuple<const_unsigned_long_&> *)&local_a8,&local_b9);
          local_a0 = local_b8;
          sVar12 = Xr_indptr[psVar3[(long)local_b8] + 1];
          if (sVar12 != sVar6) {
            local_b0 = *(double **)((pVar29.first.m_bucket.m_bucket)->m_value + 8);
            do {
              sVar9 = Xr_ind[sVar6];
              dVar17 = fma((double)local_b0,Xr[sVar6],buffer_sum_tot[sVar9]);
              buffer_sum_tot[sVar9] = dVar17;
              sVar6 = sVar6 + 1;
            } while (sVar12 != sVar6);
          }
          local_b8 = (double)((long)local_a0 + 1);
          dVar17 = local_b8;
        } while ((ulong)local_b8 <= (ulong)local_88);
      }
    }
    else {
      pdVar28 = local_68 + local_80;
      local_b8 = local_90;
      local_48 = pdVar28;
      do {
        sVar6 = Xr_indptr[local_98[(long)local_b8]];
        sVar12 = Xr_indptr[local_98[(long)local_b8] + 1];
        if (sVar6 != sVar12) {
          local_a8._M_head_impl = local_98 + (long)local_b8;
          if (!x_uses_ix_arr) {
            local_a8._M_head_impl = (unsigned_long *)&local_b8;
          }
          pVar29 = tsl::detail_robin_hash::
                   robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                   ::
                   insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                             ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                               *)w,local_a8._M_head_impl,
                              (piecewise_construct_t *)&std::piecewise_construct,
                              (tuple<const_unsigned_long_&> *)&local_a8,&local_b9);
          if ((0 < (long)local_80) && ((long)sVar6 < (long)sVar12)) {
            pdVar5 = (double *)(Xr_ind + sVar12);
            local_b0 = Xr + sVar6;
            local_a0 = *(double *)((pVar29.first.m_bucket.m_bucket)->m_value + 8);
            pdVar27 = (double *)(Xr_ind + sVar6);
            pdVar8 = local_68;
            do {
              dVar17 = *pdVar27;
              dVar15 = *pdVar8;
              if (dVar17 == dVar15) {
                lVar11 = (long)pdVar8 - (long)local_68;
                dVar17 = fma(local_a0,*(double *)((long)local_b0 + ((long)pdVar5 - (long)pdVar27)),
                             *(double *)((long)buffer_sum_tot + lVar11));
                *(double *)((long)buffer_sum_tot + lVar11) = dVar17;
                pdVar8 = pdVar8 + 1;
                pdVar27 = pdVar27 + 1;
                pdVar28 = local_48;
              }
              else if ((ulong)dVar15 < (ulong)dVar17) {
                uVar2 = (long)pdVar28 - (long)pdVar8 >> 3;
                while (0 < (long)uVar2) {
                  uVar7 = uVar2 >> 1;
                  uVar10 = ~uVar7 + uVar2;
                  uVar2 = uVar7;
                  if ((ulong)pdVar8[uVar7] < (ulong)dVar17) {
                    uVar2 = uVar10;
                    pdVar8 = pdVar8 + uVar7 + 1;
                  }
                }
              }
              else {
                uVar2 = (long)pdVar5 - (long)pdVar27 >> 3;
                while (0 < (long)uVar2) {
                  uVar7 = uVar2 >> 1;
                  uVar10 = ~uVar7 + uVar2;
                  uVar2 = uVar7;
                  if ((ulong)(pdVar27 + uVar7 + 1)[-1] < (ulong)dVar15) {
                    uVar2 = uVar10;
                    pdVar27 = pdVar27 + uVar7 + 1;
                  }
                }
              }
            } while ((pdVar8 < pdVar28) && (pdVar27 < pdVar5));
          }
        }
        local_b8 = (double)((long)local_b8 + 1);
      } while ((ulong)local_b8 <= (ulong)local_88);
    }
    memset(buffer_sum_left,0,local_38);
    pdVar28 = local_68;
    local_b8 = local_90;
    if (Xr_indptr == (size_t *)0x0) {
      if (local_58._0_1_ == '\0') {
        local_a0 = -INFINITY;
        pdVar28 = (double *)0x0;
        uStack_60 = 0;
        do {
          psVar3 = local_98;
          local_a8._M_head_impl = local_98 + (long)local_b8;
          if (!x_uses_ix_arr) {
            local_a8._M_head_impl = (unsigned_long *)&local_b8;
          }
          local_68 = pdVar28;
          pVar29 = tsl::detail_robin_hash::
                   robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                   ::
                   insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                             ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                               *)w,local_a8._M_head_impl,
                              (piecewise_construct_t *)&std::piecewise_construct,
                              (tuple<const_unsigned_long_&> *)&local_a8,&local_b9);
          local_90 = local_b8;
          sVar6 = psVar3[(long)local_b8];
          pdVar28 = *(double **)((pVar29.first.m_bucket.m_bucket)->m_value + 8);
          if (ncols != 0) {
            sVar12 = 0;
            local_b0 = pdVar28;
            do {
              dVar17 = fma((double)local_b0,X_row_major[sVar6 * ncols + sVar12],
                           buffer_sum_left[sVar12]);
              buffer_sum_left[sVar12] = dVar17;
              sVar12 = sVar12 + 1;
              pdVar28 = local_b0;
            } while (ncols != sVar12);
          }
          pdVar28 = (double *)((double)local_68 + (double)pdVar28);
          if (x_uses_ix_arr) {
            bVar13 = NAN(local_78[sVar6]) || NAN(local_78[local_98[(long)local_90 + 1]]);
            bVar14 = local_78[sVar6] == local_78[local_98[(long)local_90 + 1]];
          }
          else {
            bVar13 = NAN(local_78[(long)local_90]) || NAN(local_78[(long)local_90 + 1]);
            bVar14 = local_78[(long)local_90] == local_78[(long)local_90 + 1];
          }
          if ((!bVar14) || (bVar13)) {
            if (ncols == 0) {
              dVar17 = 0.0;
            }
            else {
              auVar21._0_8_ = local_70 - (double)pdVar28;
              auVar21._8_8_ = pdVar28;
              dVar15 = 0.0;
              dVar17 = 0.0;
              sVar6 = 0;
              do {
                dVar1 = buffer_sum_left[sVar6];
                auVar26._8_8_ = dVar1;
                auVar26._0_8_ = buffer_sum_tot[sVar6] - dVar1;
                auVar23 = divpd(auVar26,auVar21);
                dVar15 = dVar15 + auVar23._0_8_ * (buffer_sum_tot[sVar6] - dVar1);
                dVar17 = dVar17 + auVar23._8_8_ * dVar1;
                sVar6 = sVar6 + 1;
              } while (ncols != sVar6);
              dVar17 = dVar17 + dVar15;
            }
            if (local_a0 < dVar17) {
              *split_ix = (size_t)local_90;
              local_a0 = dVar17;
            }
          }
          local_b8 = (double)((long)local_90 + 1);
          pdVar5 = local_68;
        } while ((ulong)local_b8 < (ulong)local_88);
      }
      else {
        local_a0 = -INFINITY;
        pdVar27 = (double *)0x0;
        uStack_40 = 0;
        do {
          sVar6 = local_80;
          psVar3 = local_98;
          local_a8._M_head_impl = local_98 + (long)local_b8;
          if (!x_uses_ix_arr) {
            local_a8._M_head_impl = (unsigned_long *)&local_b8;
          }
          local_48 = pdVar27;
          pVar29 = tsl::detail_robin_hash::
                   robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                   ::
                   insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                             ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                               *)w,local_a8._M_head_impl,
                              (piecewise_construct_t *)&std::piecewise_construct,
                              (tuple<const_unsigned_long_&> *)&local_a8,&local_b9);
          local_90 = local_b8;
          sVar12 = psVar3[(long)local_b8];
          pdVar27 = *(double **)((pVar29.first.m_bucket.m_bucket)->m_value + 8);
          if (sVar6 != 0) {
            sVar9 = 0;
            local_b0 = pdVar27;
            do {
              dVar17 = fma((double)local_b0,X_row_major[sVar12 * ncols + (long)pdVar28[sVar9]],
                           buffer_sum_left[sVar9]);
              buffer_sum_left[sVar9] = dVar17;
              sVar9 = sVar9 + 1;
              pdVar27 = local_b0;
            } while (sVar6 != sVar9);
          }
          pdVar27 = (double *)((double)local_48 + (double)pdVar27);
          if (x_uses_ix_arr) {
            bVar13 = NAN(local_78[sVar12]) || NAN(local_78[local_98[(long)local_90 + 1]]);
            bVar14 = local_78[sVar12] == local_78[local_98[(long)local_90 + 1]];
          }
          else {
            bVar13 = NAN(local_78[(long)local_90]) || NAN(local_78[(long)local_90 + 1]);
            bVar14 = local_78[(long)local_90] == local_78[(long)local_90 + 1];
          }
          if ((!bVar14) || (bVar13)) {
            if (local_80 == 0) {
              dVar17 = 0.0;
            }
            else {
              auVar19._0_8_ = local_70 - (double)pdVar27;
              auVar19._8_8_ = pdVar27;
              dVar15 = 0.0;
              dVar17 = 0.0;
              sVar6 = 0;
              do {
                dVar1 = buffer_sum_left[sVar6];
                auVar24._8_8_ = dVar1;
                auVar24._0_8_ = buffer_sum_tot[sVar6] - dVar1;
                auVar23 = divpd(auVar24,auVar19);
                dVar15 = dVar15 + auVar23._0_8_ * (buffer_sum_tot[sVar6] - dVar1);
                dVar17 = dVar17 + auVar23._8_8_ * dVar1;
                sVar6 = sVar6 + 1;
              } while (local_80 != sVar6);
              dVar17 = dVar17 + dVar15;
            }
            if (local_a0 < dVar17) {
              *split_ix = (size_t)local_90;
              local_a0 = dVar17;
            }
          }
          local_b8 = (double)((long)local_90 + 1);
          pdVar5 = local_68;
        } while ((ulong)local_b8 < (ulong)local_88);
      }
    }
    else if (local_58._0_1_ == '\0') {
      local_a0 = -INFINITY;
      local_68 = (double *)0x0;
      uStack_60 = 0;
      do {
        psVar3 = local_98;
        local_a8._M_head_impl = local_98 + (long)local_b8;
        if (!x_uses_ix_arr) {
          local_a8._M_head_impl = (unsigned_long *)&local_b8;
        }
        pVar29 = tsl::detail_robin_hash::
                 robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                 ::
                 insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                           ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                             *)w,local_a8._M_head_impl,
                            (piecewise_construct_t *)&std::piecewise_construct,
                            (tuple<const_unsigned_long_&> *)&local_a8,&local_b9);
        local_48 = (double *)psVar3[(long)local_b8];
        sVar12 = Xr_indptr[(long)local_48 + 1];
        pdVar27 = *(double **)((pVar29.first.m_bucket.m_bucket)->m_value + 8);
        local_90 = local_b8;
        pdVar28 = local_b0;
        pdVar5 = local_68;
        for (sVar6 = Xr_indptr[(long)local_48]; local_b0 = pdVar27, sVar12 != sVar6;
            sVar6 = sVar6 + 1) {
          sVar9 = Xr_ind[sVar6];
          local_68 = pdVar5;
          dVar17 = fma((double)local_b0,Xr[sVar6],buffer_sum_left[sVar9]);
          buffer_sum_left[sVar9] = dVar17;
          pdVar27 = local_b0;
          pdVar28 = local_b0;
          pdVar5 = local_68;
        }
        local_68 = (double *)((double)pdVar5 + (double)local_b0);
        if (x_uses_ix_arr) {
          bVar13 = NAN(local_78[(long)local_48]) || NAN(local_78[local_98[(long)local_90 + 1]]);
          bVar14 = local_78[(long)local_48] == local_78[local_98[(long)local_90 + 1]];
        }
        else {
          bVar13 = NAN(local_78[(long)local_90]) || NAN(local_78[(long)local_90 + 1]);
          bVar14 = local_78[(long)local_90] == local_78[(long)local_90 + 1];
        }
        if ((!bVar14) || (bVar13)) {
          if (ncols == 0) {
            dVar17 = 0.0;
          }
          else {
            auVar20._0_8_ = local_70 - (double)local_68;
            auVar20._8_8_ = local_68;
            dVar15 = 0.0;
            dVar17 = 0.0;
            sVar6 = 0;
            do {
              dVar1 = buffer_sum_left[sVar6];
              auVar25._8_8_ = dVar1;
              auVar25._0_8_ = buffer_sum_tot[sVar6] - dVar1;
              auVar23 = divpd(auVar25,auVar20);
              dVar15 = dVar15 + auVar23._0_8_ * (buffer_sum_tot[sVar6] - dVar1);
              dVar17 = dVar17 + auVar23._8_8_ * dVar1;
              sVar6 = sVar6 + 1;
            } while (ncols != sVar6);
            dVar17 = dVar17 + dVar15;
          }
          if (local_a0 < dVar17) {
            *split_ix = (size_t)local_90;
            local_a0 = dVar17;
          }
        }
        local_b8 = (double)((long)local_90 + 1);
        local_b0 = pdVar28;
      } while ((ulong)local_b8 < (ulong)local_88);
    }
    else {
      pdVar28 = local_68 + local_80;
      local_a0 = -INFINITY;
      local_58 = 0.0;
      uStack_50 = 0;
      do {
        psVar3 = local_98;
        local_a8._M_head_impl = local_98 + (long)local_b8;
        if (!x_uses_ix_arr) {
          local_a8._M_head_impl = (unsigned_long *)&local_b8;
        }
        pVar29 = tsl::detail_robin_hash::
                 robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                 ::
                 insert_impl<unsigned_long,std::piecewise_construct_t_const&,std::tuple<unsigned_long_const&>,std::tuple<>>
                           ((robin_hash<std::pair<unsigned_long,double>,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::KeySelect,tsl::robin_map<unsigned_long,double,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>::ValueSelect,std::hash<unsigned_long>,std::equal_to<unsigned_long>,std::allocator<std::pair<unsigned_long,double>>,false,tsl::rh::power_of_two_growth_policy<2ul>>
                             *)w,local_a8._M_head_impl,
                            (piecewise_construct_t *)&std::piecewise_construct,
                            (tuple<const_unsigned_long_&> *)&local_a8,&local_b9);
        local_b0 = *(double **)((pVar29.first.m_bucket.m_bucket)->m_value + 8);
        local_90 = local_b8;
        local_38 = psVar3[(long)local_b8];
        sVar6 = Xr_indptr[local_38];
        sVar12 = Xr_indptr[local_38 + 1];
        if (((sVar6 != sVar12) && (0 < (long)local_80)) && ((long)sVar6 < (long)sVar12)) {
          pdVar5 = (double *)(Xr_ind + sVar12);
          local_48 = Xr + sVar6;
          pdVar27 = (double *)(Xr_ind + sVar6);
          pdVar8 = local_68;
          do {
            dVar17 = *pdVar27;
            dVar15 = *pdVar8;
            if (dVar17 == dVar15) {
              lVar11 = (long)pdVar8 - (long)local_68;
              dVar17 = fma((double)local_b0,
                           *(double *)((long)local_48 + ((long)pdVar5 - (long)pdVar27)),
                           *(double *)((long)buffer_sum_left + lVar11));
              *(double *)((long)buffer_sum_left + lVar11) = dVar17;
              pdVar8 = pdVar8 + 1;
              pdVar27 = pdVar27 + 1;
            }
            else if ((ulong)dVar15 < (ulong)dVar17) {
              uVar2 = (long)pdVar28 - (long)pdVar8 >> 3;
              while (0 < (long)uVar2) {
                uVar7 = uVar2 >> 1;
                uVar10 = ~uVar7 + uVar2;
                uVar2 = uVar7;
                if ((ulong)pdVar8[uVar7] < (ulong)dVar17) {
                  uVar2 = uVar10;
                  pdVar8 = pdVar8 + uVar7 + 1;
                }
              }
            }
            else {
              uVar2 = (long)pdVar5 - (long)pdVar27 >> 3;
              while (0 < (long)uVar2) {
                uVar7 = uVar2 >> 1;
                uVar10 = ~uVar7 + uVar2;
                uVar2 = uVar7;
                if ((ulong)(pdVar27 + uVar7 + 1)[-1] < (ulong)dVar15) {
                  uVar2 = uVar10;
                  pdVar27 = pdVar27 + uVar7 + 1;
                }
              }
            }
          } while ((pdVar8 < pdVar28) && (pdVar27 < pdVar5));
        }
        local_58 = local_58 + (double)local_b0;
        if (x_uses_ix_arr) {
          bVar13 = NAN(local_78[local_38]) || NAN(local_78[local_98[(long)local_90 + 1]]);
          bVar14 = local_78[local_38] == local_78[local_98[(long)local_90 + 1]];
        }
        else {
          bVar13 = NAN(local_78[(long)local_90]) || NAN(local_78[(long)local_90 + 1]);
          bVar14 = local_78[(long)local_90] == local_78[(long)local_90 + 1];
        }
        if ((!bVar14) || (bVar13)) {
          if (local_80 == 0) {
            dVar17 = 0.0;
          }
          else {
            auVar18._0_8_ = local_70 - local_58;
            auVar18._8_8_ = local_58;
            dVar15 = 0.0;
            dVar17 = 0.0;
            sVar6 = 0;
            do {
              dVar1 = buffer_sum_left[sVar6];
              auVar22._8_8_ = dVar1;
              auVar22._0_8_ = buffer_sum_tot[sVar6] - dVar1;
              auVar23 = divpd(auVar22,auVar18);
              dVar15 = dVar15 + auVar23._0_8_ * (buffer_sum_tot[sVar6] - dVar1);
              dVar17 = dVar17 + auVar23._8_8_ * dVar1;
              sVar6 = sVar6 + 1;
            } while (local_80 != sVar6);
            dVar17 = dVar17 + dVar15;
          }
          if (local_a0 < dVar17) {
            *split_ix = (size_t)local_90;
            local_a0 = dVar17;
          }
        }
        local_b8 = (double)((long)local_90 + 1);
        pdVar5 = local_68;
      } while ((ulong)local_b8 < (ulong)local_88);
    }
    local_68 = pdVar5;
    dVar17 = -INFINITY;
    if (-INFINITY < local_a0) {
      dVar17 = midpoint<float>(local_78[local_98[*split_ix]],local_78[local_98[*split_ix + 1]]);
      *split_point = dVar17;
      dVar17 = local_a0 / local_70;
    }
  }
  else {
    dVar17 = -INFINITY;
  }
  return dVar17;
}

Assistant:

double find_split_full_gain_weighted(real_t *restrict x, size_t st, size_t end, size_t *restrict ix_arr,
                                     size_t *restrict cols_use, size_t ncols_use, bool force_cols_use,
                                     double *restrict X_row_major, size_t ncols,
                                     double *restrict Xr, size_t *restrict Xr_ind, size_t *restrict Xr_indptr,
                                     double *restrict buffer_sum_left, double *restrict buffer_sum_tot,
                                     size_t &restrict split_ix, double &restrict split_point,
                                     bool x_uses_ix_arr,
                                     mapping &restrict w)
{
    if (end <= st) return -HUGE_VAL;
    if (cols_use != NULL && ncols_use && (double)ncols_use / (double)ncols < 0.1)
        force_cols_use = true;

    double wtot = 0;
    if (x_uses_ix_arr)
    {
        for (size_t row = st; row <= end; row++)
            wtot += w[ix_arr[row]];
    }

    else
    {
        for (size_t row = st; row <= end; row++)
            wtot += w[row];
    }

    memset(buffer_sum_tot, 0, (force_cols_use? ncols_use : ncols)*sizeof(double));
    if (Xr_indptr == NULL)
    {
        if (!force_cols_use)
        {
            if (x_uses_ix_arr)
            {
                for (size_t row = st; row <= end; row++)
                    axpy1(w[ix_arr[row]], X_row_major + ix_arr[row]*ncols, buffer_sum_tot, ncols);
            }

            else
            {
                for (size_t row = st; row <= end; row++)
                    axpy1(w[row], X_row_major + ix_arr[row]*ncols, buffer_sum_tot, ncols);
            }
        }

        else
        {
            double *restrict ptr_row;
            double w_row;

            if (x_uses_ix_arr)
            {
                for (size_t row = st; row <= end; row++)
                {
                    ptr_row = X_row_major + ix_arr[row]*ncols;
                    w_row = w[ix_arr[row]];
                    for (size_t col = 0; col < ncols_use; col++)
                        buffer_sum_tot[col] = std::fma(w_row, ptr_row[cols_use[col]], buffer_sum_tot[col]);
                }
            }

            else
            {
                for (size_t row = st; row <= end; row++)
                {
                    ptr_row = X_row_major + ix_arr[row]*ncols;
                    w_row = w[row];
                    for (size_t col = 0; col < ncols_use; col++)
                        buffer_sum_tot[col] = std::fma(w_row, ptr_row[cols_use[col]], buffer_sum_tot[col]);
                }
            }
        }
    }

    else
    {
        if (!force_cols_use)
        {
            size_t ptr_this;
            if (x_uses_ix_arr)
            {
                for (size_t row = st; row <= end; row++)
                {
                    ptr_this = Xr_indptr[ix_arr[row]];
                    axpy1(w[ix_arr[row]], Xr + ptr_this, Xr_ind + ptr_this, Xr_indptr[ix_arr[row]+1] - ptr_this, buffer_sum_tot);
                }
            }

            else
            {
                for (size_t row = st; row <= end; row++)
                {
                    ptr_this = Xr_indptr[ix_arr[row]];
                    axpy1(w[row], Xr + ptr_this, Xr_ind + ptr_this, Xr_indptr[ix_arr[row]+1] - ptr_this, buffer_sum_tot);
                }
            }
        }

        else
        {
            size_t *curr_begin;
            size_t *row_end;
            size_t *curr_col;
            double *restrict Xr_this;
            size_t *cols_end = cols_use + ncols_use;
            double w_row;
            for (size_t row = st; row <= end; row++)
            {
                curr_begin = Xr_ind + Xr_indptr[ix_arr[row]];
                row_end = Xr_ind + Xr_indptr[ix_arr[row] + 1];
                if (curr_begin == row_end) continue;
                curr_col = cols_use;
                Xr_this = Xr + Xr_indptr[ix_arr[row]];
                w_row = w[x_uses_ix_arr? ix_arr[row] : row];
                size_t dtemp;
                
                while (curr_col < cols_end && curr_begin < row_end)
                {
                    if (*curr_begin == *curr_col)
                    {
                        dtemp = std::distance(cols_use, curr_col);
                        buffer_sum_tot[dtemp]
                            =
                        std::fma(w_row, Xr_this[std::distance(curr_begin, row_end)], buffer_sum_tot[dtemp]);
                        curr_col++;
                        curr_begin++;
                    }

                    else
                    {
                        if (*curr_begin > *curr_col)
                            curr_col = std::lower_bound(curr_col, cols_end, *curr_begin);
                        else
                            curr_begin = std::lower_bound(curr_begin, row_end, *curr_col);
                    }
                }
            }
        }
    }

    double best_gain = -HUGE_VAL;
    double this_gain;
    double sl, sr;
    double vleft, vright;
    double wleft = 0;
    double w_row;
    double wright;
    memset(buffer_sum_left, 0, (force_cols_use? ncols_use : ncols)*sizeof(double));
    if (Xr_indptr == NULL)
    {
        if (!force_cols_use)
        {
            for (size_t row = st; row < end; row++)
            {
                w_row = w[x_uses_ix_arr? ix_arr[row] : row];
                wleft += w_row;
                axpy1(w_row, X_row_major + ix_arr[row]*ncols, buffer_sum_left, ncols);
                if (x_uses_ix_arr) {
                    if (unlikely(x[ix_arr[row]] == x[ix_arr[row+1]])) continue;
                }
                else {
                    if (unlikely(x[row] == x[row+1])) continue;
                }

                vleft = 0;
                vright = 0;
                wright = wtot - wleft;
                for (size_t col = 0; col < ncols; col++)
                {
                    sl = buffer_sum_left[col];
                    vleft += sl * (sl / wleft);
                    sr = buffer_sum_tot[col] - sl;
                    vright += sr * (sr / wright);
                }

                this_gain = vleft + vright;
                if (this_gain > best_gain)
                {
                    best_gain = this_gain;
                    split_ix = row;
                }
            }
        }

        else
        {
            double *restrict ptr_row;
            double w_row;
            for (size_t row = st; row < end; row++)
            {
                w_row = w[x_uses_ix_arr? ix_arr[row] : row];
                wleft += w_row;

                ptr_row = X_row_major + ix_arr[row]*ncols;
                for (size_t col = 0; col < ncols_use; col++)
                    buffer_sum_left[col] = std::fma(w_row, ptr_row[cols_use[col]], buffer_sum_left[col]);
                if (x_uses_ix_arr) {
                    if (unlikely(x[ix_arr[row]] == x[ix_arr[row+1]])) continue;
                }
                else {
                    if (unlikely(x[row] == x[row+1])) continue;
                }

                vleft = 0;
                vright = 0;
                wright = wtot - wleft;
                for (size_t col = 0; col < ncols_use; col++)
                {
                    sl = buffer_sum_left[col];
                    vleft += sl * (sl / wleft);
                    sr = buffer_sum_tot[col] - sl;
                    vright += sr * (sr / wright);
                }

                this_gain = vleft + vright;
                if (this_gain > best_gain)
                {
                    best_gain = this_gain;
                    split_ix = row;
                }
            }
        }
    }

    else
    {
        if (!force_cols_use)
        {
            size_t ptr_this;
            double w_row;
            for (size_t row = st; row < end; row++)
            {
                w_row= w[x_uses_ix_arr? ix_arr[row] : row];
                wleft += w_row;
                ptr_this = Xr_indptr[ix_arr[row]];
                axpy1(w_row, Xr + ptr_this, Xr_ind + ptr_this, Xr_indptr[ix_arr[row]+1] - ptr_this, buffer_sum_left);
                if (x_uses_ix_arr) {
                    if (unlikely(x[ix_arr[row]] == x[ix_arr[row+1]])) continue;
                }
                else {
                    if (unlikely(x[row] == x[row+1])) continue;
                }

                vleft = 0;
                vright = 0;
                wright = wtot - wleft;
                for (size_t col = 0; col < ncols; col++)
                {
                    sl = buffer_sum_left[col];
                    vleft += sl * (sl / wleft);
                    sr = buffer_sum_tot[col] - sl;
                    vright += sr * (sr / wright);
                }

                this_gain = vleft + vright;
                if (this_gain > best_gain)
                {
                    best_gain = this_gain;
                    split_ix = row;
                }
            }
        }

        else
        {
            size_t *curr_begin;
            size_t *row_end;
            size_t *curr_col;
            double *restrict Xr_this;
            size_t *cols_end = cols_use + ncols_use;
            double w_row;
            size_t dtemp;
            for (size_t row = st; row < end; row++)
            {
                w_row = w[x_uses_ix_arr? ix_arr[row] : row];
                wleft += w_row;
                
                curr_begin = Xr_ind + Xr_indptr[ix_arr[row]];
                row_end = Xr_ind + Xr_indptr[ix_arr[row] + 1];
                if (curr_begin == row_end) goto skip_sum;
                curr_col = cols_use;
                Xr_this = Xr + Xr_indptr[ix_arr[row]];
                while (curr_col < cols_end && curr_begin < row_end)
                {
                    if (*curr_begin == *curr_col)
                    {
                        dtemp = std::distance(cols_use, curr_col);
                        buffer_sum_left[dtemp]
                            =
                        std::fma(w_row, Xr_this[std::distance(curr_begin, row_end)], buffer_sum_left[dtemp]);
                        curr_col++;
                        curr_begin++;
                    }

                    else
                    {
                        if (*curr_begin > *curr_col)
                            curr_col = std::lower_bound(curr_col, cols_end, *curr_begin);
                        else
                            curr_begin = std::lower_bound(curr_begin, row_end, *curr_col);
                    }
                }

                skip_sum:
                if (x_uses_ix_arr) {
                    if (unlikely(x[ix_arr[row]] == x[ix_arr[row+1]])) continue;
                }
                else {
                    if (unlikely(x[row] == x[row+1])) continue;
                }

                vleft = 0;
                vright = 0;
                wright = wtot - wleft;
                for (size_t col = 0; col < ncols_use; col++)
                {
                    sl = buffer_sum_left[col];
                    vleft += sl * (sl / wleft);
                    sr = buffer_sum_tot[col] - sl;
                    vright += sr * (sr / wright);
                }

                this_gain = vleft + vright;
                if (this_gain > best_gain)
                {
                    best_gain = this_gain;
                    split_ix = row;
                }
            }
        }
    }

    if (best_gain  <= -HUGE_VAL) return best_gain;
    
    split_point = midpoint(x[ix_arr[split_ix]], x[ix_arr[split_ix+1]]);
    return best_gain / wtot;
}